

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void BreakdownVarName(char *Name,char **base_name_p,int *type_p,int *element_size_p)

{
  char *pcVar1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined8 *in_RSI;
  char *in_RDI;
  char *NameStart;
  int ElementSize;
  int Type;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 *local_20;
  undefined4 *local_18;
  undefined8 *local_10;
  char *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pcVar1 = strchr(in_RDI,0x5f);
  pcVar1 = strchr(pcVar1 + 1,0x5f);
  __isoc99_sscanf(local_8,"SST%d_%d_",&local_28,&local_24);
  *local_20 = local_28;
  *local_18 = local_24;
  pcVar1 = strdup(pcVar1 + 1);
  *local_10 = pcVar1;
  return;
}

Assistant:

static void BreakdownVarName(const char *Name, char **base_name_p, int *type_p, int *element_size_p)
{
    int Type;
    int ElementSize;
    const char *NameStart = strchr(strchr(Name, '_') + 1, '_') + 1;
    sscanf(Name, "SST%d_%d_", &ElementSize, &Type);
    *element_size_p = ElementSize;
    *type_p = Type;
    *base_name_p = strdup(NameStart);
}